

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

int png_crc_finish(png_structrp png_ptr,png_uint_32 skip)

{
  int iVar1;
  png_byte local_428 [8];
  png_byte tmpbuf [1024];
  png_uint_32 local_20;
  uint local_1c;
  png_uint_32 len;
  png_uint_32 skip_local;
  png_structrp png_ptr_local;
  
  local_1c = skip;
  while (local_1c != 0) {
    local_20 = 0x400;
    if (local_1c < 0x400) {
      local_20 = local_1c;
    }
    local_1c = local_1c - local_20;
    png_crc_read(png_ptr,local_428,local_20);
  }
  iVar1 = png_crc_error(png_ptr);
  if (iVar1 == 0) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    if ((png_ptr->chunk_name >> 0x1d & 1) == 0) {
      if ((png_ptr->flags & 0x400) == 0) goto LAB_0013c45c;
    }
    else if ((png_ptr->flags & 0x200) != 0) {
LAB_0013c45c:
      png_chunk_error(png_ptr,"CRC error");
    }
    png_chunk_warning(png_ptr,"CRC error");
    png_ptr_local._4_4_ = 1;
  }
  return png_ptr_local._4_4_;
}

Assistant:

int /* PRIVATE */
png_crc_finish(png_structrp png_ptr, png_uint_32 skip)
{
   /* The size of the local buffer for inflate is a good guess as to a
    * reasonable size to use for buffering reads from the application.
    */
   while (skip > 0)
   {
      png_uint_32 len;
      png_byte tmpbuf[PNG_INFLATE_BUF_SIZE];

      len = (sizeof tmpbuf);
      if (len > skip)
         len = skip;
      skip -= len;

      png_crc_read(png_ptr, tmpbuf, len);
   }

   if (png_crc_error(png_ptr) != 0)
   {
      if (PNG_CHUNK_ANCILLARY(png_ptr->chunk_name) != 0 ?
          (png_ptr->flags & PNG_FLAG_CRC_ANCILLARY_NOWARN) == 0 :
          (png_ptr->flags & PNG_FLAG_CRC_CRITICAL_USE) != 0)
      {
         png_chunk_warning(png_ptr, "CRC error");
      }

      else
         png_chunk_error(png_ptr, "CRC error");

      return (1);
   }

   return (0);
}